

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O3

bool __thiscall
QNetworkCookieJar::validateCookie(QNetworkCookieJar *this,QNetworkCookie *cookie,QUrl *url)

{
  int *piVar1;
  storage_type_conflict *psVar2;
  char cVar3;
  bool bVar4;
  CutResult CVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  storage_type_conflict *psVar8;
  char16_t *pcVar9;
  undefined1 *originalLength;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView domain;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  QString local_58;
  undefined1 *local_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCookie::domain(&local_58,cookie);
  originalLength = (undefined1 *)local_58.d.size;
  pcVar9 = local_58.d.ptr;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  QUrl::host(&local_78,url,0x7f00000);
  puVar6 = local_68;
  psVar2 = (storage_type_conflict *)CONCAT44(uStack_6c,uStack_70);
  if ((local_68 == (undefined1 *)0x0) || (*psVar2 != L'.')) {
    psVar8 = psVar2;
    if (originalLength == local_68) {
LAB_0018b191:
      QVar11.m_data = pcVar9;
      QVar11.m_size = (qsizetype)originalLength;
      QVar17.m_data = psVar8;
      QVar17.m_size = (qsizetype)originalLength;
      cVar3 = QtPrivate::equalStrings(QVar11,QVar17);
      if (cVar3 != '\0') goto LAB_0018b241;
    }
LAB_0018b1c2:
    puVar6 = local_68;
    psVar2 = (storage_type_conflict *)CONCAT44(uStack_6c,uStack_70);
    if ((originalLength == (undefined1 *)0x0) || (*pcVar9 != L'.')) {
      if ((local_68 != originalLength) ||
         (QVar13.m_data = psVar2, QVar13.m_size = (qsizetype)originalLength, QVar19.m_data = pcVar9,
         QVar19.m_size = (qsizetype)originalLength, cVar3 = QtPrivate::equalStrings(QVar13,QVar19),
         cVar3 == '\0')) {
        bVar4 = false;
        goto LAB_0018b290;
      }
      goto LAB_0018b241;
    }
    QVar12.m_data = psVar2;
    QVar12.m_size = (qsizetype)local_68;
    QVar18.m_data = pcVar9;
    QVar18.m_size = (qsizetype)originalLength;
    cVar3 = QtPrivate::endsWith(QVar12,QVar18,CaseSensitive);
    if (cVar3 == '\0') {
      local_38 = 1;
      local_40 = (undefined1 *)0xffffffffffffffff;
      CVar5 = QtPrivate::QContainerImplHelper::mid
                        ((qsizetype)originalLength,&local_38,(qsizetype *)&local_40);
      bVar4 = false;
      puVar7 = local_40;
      if (CVar5 == Null) {
        puVar7 = (undefined1 *)0x0;
      }
      if (puVar7 != puVar6) goto LAB_0018b290;
      bVar4 = false;
      psVar8 = (storage_type_conflict *)0x0;
      if (CVar5 != Null) {
        psVar8 = pcVar9 + local_38;
      }
      QVar15.m_data = psVar2;
      QVar15.m_size = (qsizetype)puVar6;
      QVar21.m_data = psVar8;
      QVar21.m_size = (qsizetype)puVar6;
      cVar3 = QtPrivate::equalStrings(QVar15,QVar21);
      if (cVar3 == '\0') goto LAB_0018b290;
      goto LAB_0018b246;
    }
LAB_0018b24c:
    pcVar9 = pcVar9 + 1;
    originalLength = (undefined1 *)((qsizetype)originalLength + -1);
  }
  else {
    QVar10.m_data = pcVar9;
    QVar10.m_size = (qsizetype)originalLength;
    QVar16.m_data = psVar2;
    QVar16.m_size = (qsizetype)local_68;
    cVar3 = QtPrivate::endsWith(QVar10,QVar16,CaseSensitive);
    if (cVar3 == '\0') {
      local_38 = 1;
      local_40 = (undefined1 *)0xffffffffffffffff;
      CVar5 = QtPrivate::QContainerImplHelper::mid
                        ((qsizetype)puVar6,&local_38,(qsizetype *)&local_40);
      puVar6 = local_40;
      if (CVar5 == Null) {
        puVar6 = (undefined1 *)0x0;
      }
      if (puVar6 == originalLength) {
        psVar8 = (storage_type_conflict *)0x0;
        if (CVar5 != Null) {
          psVar8 = psVar2 + local_38;
        }
        goto LAB_0018b191;
      }
      goto LAB_0018b1c2;
    }
LAB_0018b241:
    if (originalLength == (undefined1 *)0x0) {
      originalLength = (undefined1 *)0x0;
    }
    else {
LAB_0018b246:
      if (*pcVar9 == L'.') goto LAB_0018b24c;
    }
  }
  if (local_68 == originalLength) {
    QVar14.m_data._4_4_ = uStack_6c;
    QVar14.m_data._0_4_ = uStack_70;
    QVar14.m_size = (qsizetype)originalLength;
    QVar20.m_data = pcVar9;
    QVar20.m_size = (qsizetype)originalLength;
    cVar3 = QtPrivate::equalStrings(QVar14,QVar20);
    bVar4 = true;
    if (cVar3 != '\0') goto LAB_0018b290;
  }
  domain.m_data = pcVar9;
  domain.m_size = (qsizetype)originalLength;
  bVar4 = qIsEffectiveTLD(domain);
  bVar4 = !bVar4;
LAB_0018b290:
  piVar1 = (int *)CONCAT44(uStack_74,local_78);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QNetworkCookieJar::validateCookie(const QNetworkCookie &cookie, const QUrl &url) const
{
    const QString cookieDomain = cookie.domain();
    QStringView domain = cookieDomain;
    const QString host = url.host();
    if (!isParentDomain(domain, host) && !isParentDomain(host, domain))
        return false; // not accepted

    if (domain.startsWith(u'.'))
        domain = domain.sliced(1);

    // We shouldn't reject if:
    // "[...] the domain-attribute is identical to the canonicalized request-host"
    // https://tools.ietf.org/html/rfc6265#section-5.3 step 5
    if (host == domain)
        return true;
    // the check for effective TLDs makes the "embedded dot" rule from RFC 2109 section 4.3.2
    // redundant; the "leading dot" rule has been relaxed anyway, see QNetworkCookie::normalize()
    // we remove the leading dot for this check if it's present
    // Normally defined in qtldurl_p.h, but uses fall-back in this file when topleveldomain isn't
    // configured:
    return !qIsEffectiveTLD(domain);
}